

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O0

void asm_load_const(MCodeChunk *chunk,Trace *trace,IrIns ins)

{
  uint16_t uVar1;
  uint32_t uVar2;
  size_t offset;
  uint32_t const_slot;
  uint16_t dest_reg;
  IrIns ins_local;
  Trace *trace_local;
  MCodeChunk *chunk_local;
  
  uVar1 = ir_reg(ins);
  uVar2 = ir_arg32(ins);
  printf("movsd xmm%d, [0x%zx]\n",(ulong)uVar1,trace->vm->consts + uVar2);
  return;
}

Assistant:

static void asm_load_const(MCodeChunk *chunk, Trace *trace, IrIns ins) {
	// movsd xmm<reg>, [<consts> + <offset> * 8]
	uint16_t dest_reg = ir_reg(ins);
	uint32_t const_slot = ir_arg32(ins);
	size_t offset = (size_t) &trace->vm->consts[const_slot];
#ifdef ASM_DEBUG
	printf("movsd xmm%d, [0x%zx]\n", dest_reg, offset);
#endif
}